

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

ssize_t __thiscall mario::Buffer::readFd(Buffer *this,int fd,int *savedErrno)

{
  void *pvVar1;
  char *pcVar2;
  void *pvVar3;
  int *piVar4;
  size_type sVar5;
  ssize_t n;
  size_t writable;
  iovec vec [2];
  char extrabuf [65536];
  int *savedErrno_local;
  int fd_local;
  Buffer *this_local;
  
  pvVar1 = (void *)writableBytes(this);
  pcVar2 = begin(this);
  writable = (size_t)(pcVar2 + this->_writerIndex);
  vec[0].iov_len = (size_t)&vec[1].iov_len;
  vec[1].iov_base = (void *)0x10000;
  vec[0].iov_base = pvVar1;
  pvVar3 = (void *)readv(fd,(iovec *)&writable,2);
  if ((long)pvVar3 < 0) {
    piVar4 = __errno_location();
    *savedErrno = *piVar4;
  }
  else if (pvVar1 < pvVar3) {
    sVar5 = std::vector<char,_std::allocator<char>_>::size(&this->_buffer);
    this->_writerIndex = sVar5;
    append(this,(char *)&vec[1].iov_len,(long)pvVar3 - (long)pvVar1);
  }
  else {
    this->_writerIndex = (long)pvVar3 + this->_writerIndex;
  }
  return (ssize_t)pvVar3;
}

Assistant:

ssize_t Buffer::readFd(int fd, int* savedErrno) {
    char extrabuf[65536];
    struct iovec vec[2];
    const size_t writable = writableBytes();
    vec[0].iov_base = begin() + _writerIndex;
    vec[0].iov_len = writable;
    vec[1].iov_base = extrabuf;
    vec[1].iov_len = sizeof(extrabuf);
    const ssize_t n = readv(fd, vec, 2);
    if (n < 0) {
        *savedErrno = errno;
    } else if (n <= writable) {
        _writerIndex += n;
    } else {
        _writerIndex = _buffer.size();
        append(extrabuf, n - writable);
    }
    return n;
}